

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconmor.cpp
# Opt level: O0

void __thiscall CVmConsole::show_con_more_prompt(CVmConsole *this)

{
  bool bVar1;
  unsigned_long in_RDI;
  os_event_info_t evt;
  int next_page;
  int done;
  os_event_info_t *in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffee4;
  int local_110;
  int local_10;
  
  (**(code **)(**(long **)(in_RDI + 8) + 0x40))(*(long **)(in_RDI + 8),"[More]");
  (**(code **)(**(long **)(in_RDI + 8) + 0x48))();
  bVar1 = false;
  do {
    while( true ) {
      while( true ) {
        if (bVar1) {
          (**(code **)(**(long **)(in_RDI + 8) + 0x40))(*(long **)(in_RDI + 8),"\r      \r");
          if (local_10 != 0) {
            (**(code **)(**(long **)(in_RDI + 8) + 0x10))(*(long **)(in_RDI + 8),0);
          }
          return;
        }
        in_stack_fffffffffffffee4 =
             os_get_event(in_RDI,in_stack_fffffffffffffee4,in_stack_fffffffffffffed8);
        if (in_stack_fffffffffffffee4 == 1) break;
        if (in_stack_fffffffffffffee4 == 5) {
          bVar1 = true;
          local_10 = 1;
          G_os_moremode = 0;
        }
      }
      if ((local_110 == 10) || (local_110 == 0xd)) break;
      if (local_110 == 0x20) {
        bVar1 = true;
        local_10 = 1;
      }
      else if (local_110 == 0x2028) break;
    }
    bVar1 = true;
    local_10 = 0;
  } while( true );
}

Assistant:

void CVmConsole::show_con_more_prompt(VMG0_)
{
    int done;
    int next_page;

    /* display the "MORE" prompt */
    disp_str_->print_to_os("[More]");
    disp_str_->flush_to_os();

    /* wait for an acceptable keystroke */
    for (done = FALSE ; !done ; )
    {
        os_event_info_t evt;

        /* get an event */
        switch(os_get_event(0, FALSE, &evt))
        {
        case OS_EVT_KEY:
            switch(evt.key[0])
            {
            case ' ':
                /* stop waiting, show one page */
                done = TRUE;
                next_page = TRUE;
                break;

            case '\r':
            case '\n':
            case 0x2028:                /* unicode line separator character */
                /* stop waiting, show one line */
                done = TRUE;
                next_page = FALSE;
                break;

            default:
                /* ignore any other keystrokes */
                break;
            }
            break;

        case OS_EVT_EOF:
            /* end of file - there's nothing to wait for now */
            done = TRUE;
            next_page = TRUE;

            /* stop showing [more] prompts, as the user can't respond */
            G_os_moremode = FALSE;
            break;

        default:
            /* ignore other events */
            break;
        }
    }

    /* 
     *   Remove the prompt from the screen by backing up and overwriting
     *   it with spaces.  (Note that this assumes that we're running in
     *   some kind of terminal or character mode with a fixed-pitch font;
     *   if that's not the case, the OS layer should be taking
     *   responsibility for pagination anyway, so this code shouldn't be
     *   in use in the first place.)  
     */
    disp_str_->print_to_os( "\r      \r" );

    /* 
     *   if they pressed the space key, it means that we should show an
     *   entire new page, so reset the line count to zero; otherwise,
     *   we'll want to display another MORE prompt at the very next line,
     *   so leave the line count alone 
     */
    if (next_page)
        disp_str_->reset_line_count(FALSE);
}